

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O3

int lencode_order(lua_State *L)

{
  uint uVar1;
  char *key;
  uint8_t *puVar2;
  void *__dest;
  int iVar3;
  int iVar4;
  uint8_t *__src;
  size_t __n;
  bson b;
  bson local_90;
  size_t local_40;
  size_t local_38;
  
  puVar2 = local_90.buffer;
  local_90.size = 0;
  local_90.cap = 0x40;
  local_90.ptr = puVar2;
  uVar1 = lua_gettop(L);
  if ((uVar1 & 1) != 0) {
    luaL_error(L,"Invalid ordered dict");
  }
  __n = (size_t)local_90.size;
  iVar3 = local_90.size + 4;
  local_40 = __n;
  if (local_90.cap < iVar3) {
    do {
      local_90.cap = local_90.cap * 2;
    } while (local_90.cap <= iVar3);
    if (local_90.ptr == puVar2) {
      local_90.ptr = (uint8_t *)malloc((long)local_90.cap);
      memcpy(local_90.ptr,puVar2,__n);
    }
    else {
      local_90.ptr = (uint8_t *)realloc(local_90.ptr,(long)local_90.cap);
      iVar3 = local_90.size + 4;
    }
  }
  local_90.size = iVar3;
  if (0 < (int)uVar1) {
    iVar3 = 0;
    do {
      key = lua_tolstring(L,iVar3 + 1U,&local_38);
      if (key == (char *)0x0) {
        luaL_error(L,"Argument %d need a string",(ulong)(iVar3 + 1U));
      }
      iVar3 = iVar3 + 2;
      lua_pushvalue(L,iVar3);
      append_one(&local_90,L,key,local_38);
      lua_settop(L,-2);
    } while (iVar3 < (int)uVar1);
  }
  iVar4 = local_90.size;
  __src = local_90.buffer;
  iVar3 = local_90.size + 1;
  puVar2 = local_90.ptr;
  if (local_90.cap <= local_90.size) {
    do {
      local_90.cap = local_90.cap * 2;
    } while (local_90.cap <= iVar3);
    if (local_90.ptr == __src) {
      puVar2 = (uint8_t *)malloc((long)local_90.cap);
      local_90.ptr = puVar2;
      memcpy(puVar2,__src,(long)iVar4);
    }
    else {
      local_90.ptr = (uint8_t *)realloc(local_90.ptr,(long)local_90.cap);
      iVar3 = local_90.size + 1;
      puVar2 = local_90.ptr;
      iVar4 = local_90.size;
    }
  }
  local_90.size = iVar3;
  puVar2[iVar4] = '\0';
  iVar3 = iVar3 - (int)local_40;
  local_90.ptr[local_40] = (uint8_t)iVar3;
  local_90.ptr[local_40 + 1] = (uint8_t)((uint)iVar3 >> 8);
  local_90.ptr[local_40 + 2] = (uint8_t)((uint)iVar3 >> 0x10);
  local_90.ptr[local_40 + 3] = (uint8_t)((uint)iVar3 >> 0x18);
  lua_settop(L,1);
  __dest = lua_newuserdata(L,(long)local_90.size);
  memcpy(__dest,local_90.ptr,(long)local_90.size);
  if (local_90.ptr != __src) {
    free(local_90.ptr);
  }
  bson_meta(L);
  return 1;
}

Assistant:

static int
lencode_order(lua_State *L) {
	struct bson b;
	bson_create(&b);
	int n = lua_gettop(L);
	if (n%2 != 0) {
		return luaL_error(L, "Invalid ordered dict");
	}
	pack_ordered_dict(L, &b, n);
	lua_settop(L,1);
	void * ud = lua_newuserdata(L, b.size);
	memcpy(ud, b.ptr, b.size);
	bson_destroy(&b);
	bson_meta(L);
	return 1;
}